

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
          (sysbvm_context_t *context,char *symbolString,size_t argumentCount,sysbvm_bitflags_t flags
          ,void *userdata,sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_tuple_t value;
  undefined1 local_68 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_a3b20552 gcFrame;
  sysbvm_functionEntryPoint_t entryPoint_local;
  void *userdata_local;
  sysbvm_bitflags_t flags_local;
  size_t argumentCount_local;
  char *symbolString_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x10);
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_symbol_internWithCString(context,symbolString);
  value = sysbvm_function_createPrimitive(context,argumentCount,flags,userdata,entryPoint);
  sysbvm_context_setIntrinsicSymbolBindingValue(context,(sysbvm_tuple_t)gcFrameRecord.roots,value);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  return value;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(sysbvm_context_t *context, const char *symbolString, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    struct {
        sysbvm_tuple_t symbol;
        sysbvm_tuple_t primitiveFunction;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.symbol = sysbvm_symbol_internWithCString(context, symbolString);
    gcFrame.primitiveFunction = sysbvm_function_createPrimitive(context, argumentCount, flags, userdata, entryPoint);
    sysbvm_context_setIntrinsicSymbolBindingValue(context, gcFrame.symbol, gcFrame.primitiveFunction);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.primitiveFunction;
}